

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * createTableStmt(sqlite3 *db,Table *p)

{
  char *z;
  int iVar1;
  int iVar2;
  sqlite3 *zBuf;
  char *zType;
  Column *pCStack_58;
  int len;
  Column *pCol;
  char *zEnd;
  char *zSep2;
  char *zSep;
  char *zStmt;
  int local_28;
  int n;
  int k;
  int i;
  Table *p_local;
  sqlite3 *db_local;
  
  zStmt._4_4_ = 0;
  pCStack_58 = p->aCol;
  _k = p;
  p_local = (Table *)db;
  for (n = 0; n < _k->nCol; n = n + 1) {
    iVar1 = identLength(pCStack_58->zCnName);
    zStmt._4_4_ = iVar1 + 5 + zStmt._4_4_;
    pCStack_58 = pCStack_58 + 1;
  }
  iVar1 = identLength(_k->zName);
  if (iVar1 + zStmt._4_4_ < 0x32) {
    zSep2 = "";
    zEnd = ",";
    pCol = (Column *)0x221b67;
  }
  else {
    zSep2 = "\n  ";
    zEnd = ",\n  ";
    pCol = (Column *)anon_var_dwarf_46293;
  }
  iVar1 = _k->nCol * 6 + 0x23 + iVar1 + zStmt._4_4_;
  zBuf = (sqlite3 *)sqlite3DbMallocRaw((sqlite3 *)0x0,(long)iVar1);
  if (zBuf == (sqlite3 *)0x0) {
    sqlite3OomFault((sqlite3 *)p_local);
    db_local = (sqlite3 *)0x0;
  }
  else {
    sqlite3_snprintf(iVar1,(char *)zBuf,"CREATE TABLE ");
    local_28 = sqlite3Strlen30((char *)zBuf);
    identPut((char *)zBuf,&local_28,_k->zName);
    *(char *)((long)&zBuf->pVfs + (long)local_28) = '(';
    pCStack_58 = _k->aCol;
    local_28 = local_28 + 1;
    for (n = 0; n < _k->nCol; n = n + 1) {
      sqlite3_snprintf(iVar1 - local_28,(char *)((long)&zBuf->pVfs + (long)local_28),zSep2);
      iVar2 = sqlite3Strlen30((char *)((long)&zBuf->pVfs + (long)local_28));
      local_28 = iVar2 + local_28;
      zSep2 = zEnd;
      identPut((char *)zBuf,&local_28,pCStack_58->zCnName);
      z = createTableStmt::azType[pCStack_58->affinity + -0x41];
      iVar2 = sqlite3Strlen30(z);
      memcpy((char *)((long)&zBuf->pVfs + (long)local_28),z,(long)iVar2);
      local_28 = iVar2 + local_28;
      pCStack_58 = pCStack_58 + 1;
    }
    sqlite3_snprintf(iVar1 - local_28,(char *)((long)&zBuf->pVfs + (long)local_28),"%s",pCol);
    db_local = zBuf;
  }
  return (char *)db_local;
}

Assistant:

static char *createTableStmt(sqlite3 *db, Table *p){
  int i, k, n;
  char *zStmt;
  char *zSep, *zSep2, *zEnd;
  Column *pCol;
  n = 0;
  for(pCol = p->aCol, i=0; i<p->nCol; i++, pCol++){
    n += identLength(pCol->zCnName) + 5;
  }
  n += identLength(p->zName);
  if( n<50 ){
    zSep = "";
    zSep2 = ",";
    zEnd = ")";
  }else{
    zSep = "\n  ";
    zSep2 = ",\n  ";
    zEnd = "\n)";
  }
  n += 35 + 6*p->nCol;
  zStmt = sqlite3DbMallocRaw(0, n);
  if( zStmt==0 ){
    sqlite3OomFault(db);
    return 0;
  }
  sqlite3_snprintf(n, zStmt, "CREATE TABLE ");
  k = sqlite3Strlen30(zStmt);
  identPut(zStmt, &k, p->zName);
  zStmt[k++] = '(';
  for(pCol=p->aCol, i=0; i<p->nCol; i++, pCol++){
    static const char * const azType[] = {
        /* SQLITE_AFF_BLOB    */ "",
        /* SQLITE_AFF_TEXT    */ " TEXT",
        /* SQLITE_AFF_NUMERIC */ " NUM",
        /* SQLITE_AFF_INTEGER */ " INT",
        /* SQLITE_AFF_REAL    */ " REAL",
        /* SQLITE_AFF_FLEXNUM */ " NUM",
    };
    int len;
    const char *zType;

    sqlite3_snprintf(n-k, &zStmt[k], zSep);
    k += sqlite3Strlen30(&zStmt[k]);
    zSep = zSep2;
    identPut(zStmt, &k, pCol->zCnName);
    assert( pCol->affinity-SQLITE_AFF_BLOB >= 0 );
    assert( pCol->affinity-SQLITE_AFF_BLOB < ArraySize(azType) );
    testcase( pCol->affinity==SQLITE_AFF_BLOB );
    testcase( pCol->affinity==SQLITE_AFF_TEXT );
    testcase( pCol->affinity==SQLITE_AFF_NUMERIC );
    testcase( pCol->affinity==SQLITE_AFF_INTEGER );
    testcase( pCol->affinity==SQLITE_AFF_REAL );
    testcase( pCol->affinity==SQLITE_AFF_FLEXNUM );

    zType = azType[pCol->affinity - SQLITE_AFF_BLOB];
    len = sqlite3Strlen30(zType);
    assert( pCol->affinity==SQLITE_AFF_BLOB
            || pCol->affinity==SQLITE_AFF_FLEXNUM
            || pCol->affinity==sqlite3AffinityType(zType, 0) );
    memcpy(&zStmt[k], zType, len);
    k += len;
    assert( k<=n );
  }
  sqlite3_snprintf(n-k, &zStmt[k], "%s", zEnd);
  return zStmt;
}